

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcParser.h
# Opt level: O0

void __thiscall Calc::CalcParser::translateUnaryOperation(CalcParser *this,ProductionEnum operation)

{
  Number NVar1;
  Number result;
  Number operand;
  ProductionEnum operation_local;
  CalcParser *this_local;
  
  NVar1 = extractNumber(this);
  NVar1 = evaluate(this,operation,NVar1);
  storeNumber(this,NVar1);
  return;
}

Assistant:

void translateUnaryOperation(ProductionEnum operation) {
        auto const operand = extractNumber();
        auto const result  = evaluate(operation, operand);
        storeNumber(result);
    }